

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astUseNamedSlotsOfNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t binding;
  undefined1 local_88 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_ed380826 gcFrame;
  sysbvm_astUseNamedSlotsOfNode_t **useNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x10);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  local_88 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_88);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),*psVar1);
  binding = sysbvm_analysisEnvironment_setNewValueBinding
                      (context,*psVar1,*(sysbvm_tuple_t *)(*arguments + 0x10),0,
                       (sysbvm_tuple_t)gcFrameRecord.roots);
  sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(context,*psVar1,binding);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_88);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUseNamedSlotsOfNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUseNamedSlotsOfNode_t **useNode = (sysbvm_astUseNamedSlotsOfNode_t**)node;

    struct {
        sysbvm_tuple_t usedTuple;
        sysbvm_tuple_t localBinding;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*useNode)->super.sourcePosition);

    gcFrame.usedTuple = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*useNode)->tupleExpression, *environment);
    gcFrame.localBinding = sysbvm_analysisEnvironment_setNewValueBinding(context, *environment, (*useNode)->super.sourcePosition, SYSBVM_NULL_TUPLE, gcFrame.usedTuple);
    sysbvm_analysisAndEvaluationEnvironment_addUseTupleWithNamedSlotsBinding(context, *environment, gcFrame.localBinding);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return SYSBVM_VOID_TUPLE;
}